

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_dec.c
# Opt level: O1

int jpc_dec_process_sot(jpc_dec_t *dec,jpc_ms_t *ms)

{
  jpc_dec_tile_t *pjVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  jpc_ppxstab_t *pjVar7;
  jpc_pocpchg_t *pjVar8;
  uint_fast16_t uVar9;
  jpc_dec_cp_t *pjVar10;
  jpc_dec_ccp_t *pjVar11;
  jas_image_cmptparm_t *cmptparms;
  _Bool *p_Var12;
  jas_image_t *pjVar13;
  jpc_streamlist_t *streamlist;
  jas_stream_t **ppjVar14;
  jpc_dec_cp_t *ptr;
  jpc_pchglist_t *pjVar15;
  jas_stream_t *stream;
  uint uVar16;
  long lVar17;
  jpc_dec_ccp_t *pjVar18;
  jas_image_cmptparm_t *pjVar19;
  ulong uVar20;
  int iVar21;
  uint *buf;
  ulong uVar22;
  uint uVar23;
  ulong uVar24;
  
  if (dec->state == 4) {
    cmptparms = (jas_image_cmptparm_t *)jas_alloc2((long)dec->numcomps,0x38);
    if (cmptparms == (jas_image_cmptparm_t *)0x0) {
      return -1;
    }
    uVar23 = dec->numcomps;
    if (0 < (int)uVar23) {
      p_Var12 = &dec->cmpts->sgnd;
      pjVar19 = cmptparms;
      uVar16 = uVar23;
      do {
        pjVar19->tlx = 0;
        pjVar19->tly = 0;
        pjVar19->prec = (int)*(uint_fast16_t *)(p_Var12 + -8);
        pjVar19->sgnd = (uint)*p_Var12;
        pjVar19->width = *(uint_fast32_t *)(p_Var12 + -0x18);
        pjVar19->height = *(uint_fast32_t *)(p_Var12 + -0x10);
        pjVar19->hstep = ((jpc_dec_cmpt_t *)(p_Var12 + -0x28))->hstep;
        pjVar19->vstep = *(uint_fast32_t *)(p_Var12 + -0x20);
        pjVar19 = pjVar19 + 1;
        p_Var12 = p_Var12 + 0x40;
        uVar16 = uVar16 - 1;
      } while (uVar16 != 0);
    }
    pjVar13 = jas_image_create(uVar23,cmptparms,0x4000);
    dec->image = pjVar13;
    jas_free(cmptparms);
    if (pjVar13 == (jas_image_t *)0x0) {
      return -1;
    }
    pjVar7 = dec->ppmstab;
    if (pjVar7 != (jpc_ppxstab_t *)0x0) {
      streamlist = (jpc_streamlist_t *)jas_malloc(0x10);
      if (streamlist == (jpc_streamlist_t *)0x0) {
LAB_0011bea5:
        streamlist = (jpc_streamlist_t *)0x0;
      }
      else {
        streamlist->numstreams = 0;
        streamlist->maxstreams = 100;
        ppjVar14 = (jas_stream_t **)jas_alloc2(100,8);
        streamlist->streams = ppjVar14;
        if (ppjVar14 == (jas_stream_t **)0x0) {
          jas_free(streamlist);
          goto LAB_0011bea5;
        }
        iVar21 = streamlist->maxstreams;
        if (0 < (long)iVar21) {
          lVar17 = 0;
          do {
            streamlist->streams[lVar17] = (jas_stream_t *)0x0;
            lVar17 = lVar17 + 1;
          } while (iVar21 != lVar17);
        }
      }
      if (streamlist == (jpc_streamlist_t *)0x0) {
        streamlist = (jpc_streamlist_t *)0x0;
      }
      else if (pjVar7->numents != 0) {
        uVar20 = (*pjVar7->ents)->len;
        if (3 < uVar20) {
          buf = (uint *)(*pjVar7->ents)->data;
          iVar21 = 0;
          do {
            stream = jas_stream_memopen((char *)0x0,0);
            if (stream == (jas_stream_t *)0x0) break;
            iVar4 = streamlist->numstreams;
            iVar5 = streamlist->maxstreams;
            if (iVar5 <= iVar4) {
              ppjVar14 = (jas_stream_t **)jas_realloc2(streamlist->streams,(long)iVar5 + 0x800,8);
              if (ppjVar14 == (jas_stream_t **)0x0) break;
              lVar17 = (long)streamlist->numstreams;
              iVar6 = streamlist->maxstreams;
              if (streamlist->numstreams < iVar6) {
                do {
                  streamlist->streams[lVar17] = (jas_stream_t *)0x0;
                  lVar17 = lVar17 + 1;
                } while (iVar6 != lVar17);
              }
              streamlist->maxstreams = iVar5 + 0x400;
              streamlist->streams = ppjVar14;
            }
            iVar5 = streamlist->numstreams;
            if (iVar5 != iVar4) break;
            streamlist->streams[iVar4] = stream;
            streamlist->numstreams = iVar5 + 1;
            uVar23 = *buf;
            uVar23 = uVar23 >> 0x18 | (uVar23 & 0xff0000) >> 8 | (uVar23 & 0xff00) << 8 |
                     uVar23 << 0x18;
            uVar24 = (ulong)uVar23;
            uVar20 = uVar20 - 4;
            buf = buf + 1;
            if (uVar23 != 0) {
              do {
                if (uVar20 == 0) {
                  iVar21 = iVar21 + 1;
                  if (pjVar7->numents <= iVar21) goto LAB_0011bed4;
                  uVar20 = pjVar7->ents[iVar21]->len;
                  buf = (uint *)pjVar7->ents[iVar21]->data;
                }
                uVar22 = uVar20;
                if (uVar24 < uVar20) {
                  uVar22 = uVar24;
                }
                uVar16 = (uint)uVar22;
                uVar23 = jas_stream_write(stream,buf,uVar16);
                if (uVar23 != uVar16) goto LAB_0011bed4;
                lVar17 = (long)(int)uVar16;
                buf = (uint *)((long)buf + lVar17);
                uVar20 = uVar20 - lVar17;
                uVar24 = uVar24 - lVar17;
              } while (uVar24 != 0);
            }
            jas_stream_rewind(stream);
            if (uVar20 == 0) {
              iVar21 = iVar21 + 1;
              if (pjVar7->numents <= iVar21) goto LAB_0011beee;
              uVar20 = pjVar7->ents[iVar21]->len;
              buf = (uint *)pjVar7->ents[iVar21]->data;
            }
          } while (3 < uVar20);
        }
LAB_0011bed4:
        jpc_streamlist_destroy(streamlist);
        streamlist = (jpc_streamlist_t *)0x0;
      }
LAB_0011beee:
      dec->pkthdrstreams = streamlist;
      if (streamlist == (jpc_streamlist_t *)0x0) {
        return -1;
      }
      jpc_ppxstab_destroy(dec->ppmstab);
      dec->ppmstab = (jpc_ppxstab_t *)0x0;
    }
  }
  pjVar8 = (ms->parms).poc.pchgs;
  if (pjVar8 == (jpc_pocpchg_t *)0x0) {
    lVar17 = 0;
  }
  else {
    lVar17 = (long)pjVar8 + (dec->in->rwcnt_ - ms->len) + -4;
  }
  dec->curtileendoff = lVar17;
  uVar9 = (ms->parms).sot.tileno;
  if (dec->numtiles <= (int)uVar9) {
    jas_eprintf("invalid tile number in SOT marker segment\n");
    return -1;
  }
  pjVar1 = dec->tiles + uVar9;
  dec->curtile = pjVar1;
  bVar2 = (ms->parms).sot.partno;
  if (dec->tiles[uVar9].partno != (uint)bVar2) {
    return -1;
  }
  iVar21 = pjVar1->numparts;
  if (0 < iVar21 && iVar21 <= (int)(uint)bVar2) {
    return -1;
  }
  if ((iVar21 == 0) && (bVar3 = (ms->parms).sot.numparts, bVar3 != 0)) {
    pjVar1->numparts = (uint)bVar3;
  }
  pjVar1->pptstab = (jpc_ppxstab_t *)0x0;
  if (pjVar1->state != 0) {
    if (bVar2 - 1 == (uint)(ms->parms).sot.numparts) {
      pjVar1->state = 2;
    }
    goto LAB_0011c255;
  }
  pjVar1->state = 1;
  if (pjVar1->cp != (jpc_dec_cp_t *)0x0) {
    __assert_fail("!tile->cp",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_dec.c"
                  ,0x22c,"int jpc_dec_process_sot(jpc_dec_t *, jpc_ms_t *)");
  }
  pjVar10 = dec->cp;
  ptr = jpc_dec_cp_create((long)pjVar10->numcomps);
  if (ptr == (jpc_dec_cp_t *)0x0) {
LAB_0011c222:
    ptr = (jpc_dec_cp_t *)0x0;
  }
  else {
    ptr->flags = pjVar10->flags;
    ptr->prgord = pjVar10->prgord;
    ptr->numlyrs = pjVar10->numlyrs;
    ptr->mctid = pjVar10->mctid;
    ptr->csty = pjVar10->csty;
    jpc_pchglist_destroy(ptr->pchglist);
    ptr->pchglist = (jpc_pchglist_t *)0x0;
    pjVar15 = jpc_pchglist_copy(pjVar10->pchglist);
    ptr->pchglist = pjVar15;
    if (pjVar15 == (jpc_pchglist_t *)0x0) {
      jas_free(ptr);
      goto LAB_0011c222;
    }
    if (0 < pjVar10->numcomps) {
      pjVar18 = pjVar10->ccps;
      pjVar11 = ptr->ccps;
      lVar17 = 0;
      iVar21 = 0;
      do {
        memcpy((void *)((long)pjVar11->stepsizes + lVar17 + -0x18),
               (void *)((long)pjVar18->stepsizes + lVar17 + -0x18),0x380);
        iVar21 = iVar21 + 1;
        lVar17 = lVar17 + 0x380;
      } while (iVar21 < pjVar10->numcomps);
    }
  }
  pjVar1->cp = ptr;
  if (ptr == (jpc_dec_cp_t *)0x0) {
    return -1;
  }
  pjVar10 = dec->cp;
  pjVar10->flags = pjVar10->flags & 3;
  iVar21 = pjVar10->numcomps;
  if (0 < iVar21) {
    pjVar18 = pjVar10->ccps;
    do {
      pjVar18->flags = 0;
      pjVar18 = pjVar18 + 1;
      iVar21 = iVar21 + -1;
    } while (iVar21 != 0);
  }
LAB_0011c255:
  dec->state = 0x10;
  return 0;
}

Assistant:

static int jpc_dec_process_sot(jpc_dec_t *dec, jpc_ms_t *ms)
{
	jpc_dec_tile_t *tile;
	jpc_sot_t *sot = &ms->parms.sot;
	jas_image_cmptparm_t *compinfos;
	jas_image_cmptparm_t *compinfo;
	jpc_dec_cmpt_t *cmpt;
	int cmptno;

	if (dec->state == JPC_MH) {

		if (!(compinfos = jas_alloc2(dec->numcomps,
		  sizeof(jas_image_cmptparm_t)))) {
			return -1;
		}
		for (cmptno = 0, cmpt = dec->cmpts, compinfo = compinfos;
		  cmptno < dec->numcomps; ++cmptno, ++cmpt, ++compinfo) {
			compinfo->tlx = 0;
			compinfo->tly = 0;
			compinfo->prec = cmpt->prec;
			compinfo->sgnd = cmpt->sgnd;
			compinfo->width = cmpt->width;
			compinfo->height = cmpt->height;
			compinfo->hstep = cmpt->hstep;
			compinfo->vstep = cmpt->vstep;
		}

		if (!(dec->image = jas_image_create(dec->numcomps, compinfos,
		  JAS_CLRSPC_UNKNOWN))) {
			jas_free(compinfos);
			return -1;
		}
		jas_free(compinfos);

		/* Is the packet header information stored in PPM marker segments in
		  the main header? */
		if (dec->ppmstab) {
			/* Convert the PPM marker segment data into a collection of streams
			  (one stream per tile-part). */
			if (!(dec->pkthdrstreams = jpc_ppmstabtostreams(dec->ppmstab))) {
				return -1;
			}
			jpc_ppxstab_destroy(dec->ppmstab);
			dec->ppmstab = 0;
		}
	}

	if (sot->len > 0) {
		dec->curtileendoff = jas_stream_getrwcount(dec->in) - ms->len -
		  4 + sot->len;
	} else {
		dec->curtileendoff = 0;
	}

	if (JAS_CAST(int, sot->tileno) >= dec->numtiles) {
		jas_eprintf("invalid tile number in SOT marker segment\n");
		return -1;
	}
	/* Set the current tile. */
	dec->curtile = &dec->tiles[sot->tileno];
	tile = dec->curtile;
	/* Ensure that this is the expected part number. */
	if (sot->partno != tile->partno) {
		return -1;
	}
	if (tile->numparts > 0 && sot->partno >= tile->numparts) {
		return -1;
	}
	if (!tile->numparts && sot->numparts > 0) {
		tile->numparts = sot->numparts;
	}

	tile->pptstab = 0;

	switch (tile->state) {
	case JPC_TILE_INIT:
		/* This is the first tile-part for this tile. */
		tile->state = JPC_TILE_ACTIVE;
		assert(!tile->cp);
		if (!(tile->cp = jpc_dec_cp_copy(dec->cp))) {
			return -1;
		}
		jpc_dec_cp_resetflags(dec->cp);
		break;
	default:
		if (sot->numparts == sot->partno - 1) {
			tile->state = JPC_TILE_ACTIVELAST;
		}
		break;
	}

	/* Note: We do not increment the expected tile-part number until
	  all processing for this tile-part is complete. */

	/* We should expect to encounter other tile-part header marker
	  segments next. */
	dec->state = JPC_TPH;

	return 0;
}